

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O0

ChArchiveOut * __thiscall
chrono::ChArchiveOut::operator<<
          (ChArchiveOut *this,ChNameValue<chrono::ChEnumMapper<myEnum>_> *bVal)

{
  ChNameValue<chrono::ChEnumMapper<myEnum>_> local_30;
  ChNameValue<chrono::ChEnumMapper<myEnum>_> *local_18;
  ChNameValue<chrono::ChEnumMapper<myEnum>_> *bVal_local;
  ChArchiveOut *this_local;
  
  local_18 = bVal;
  bVal_local = (ChNameValue<chrono::ChEnumMapper<myEnum>_> *)this;
  ChNameValue<chrono::ChEnumMapper<myEnum>_>::ChNameValue(&local_30,bVal);
  out<myEnum>(this,&local_30);
  ChNameValue<chrono::ChEnumMapper<myEnum>_>::~ChNameValue(&local_30);
  return this;
}

Assistant:

ChArchiveOut& operator<<(ChNameValue<T> bVal) {
          this->out(bVal);
          return (*this);
      }